

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_csr.c
# Opt level: O0

int mbedtls_x509_csr_info(char *buf,size_t size,char *prefix,mbedtls_x509_csr *csr)

{
  undefined8 __s;
  int iVar1;
  ulong uVar2;
  char *name;
  size_t sVar3;
  char local_56 [8];
  char key_size_str [14];
  char *p;
  size_t n;
  int ret;
  mbedtls_x509_csr *csr_local;
  char *prefix_local;
  size_t size_local;
  char *buf_local;
  
  key_size_str._6_8_ = buf;
  iVar1 = snprintf(buf,size,"%sCSR version   : %d",prefix,(ulong)(uint)csr->version);
  if ((iVar1 < 0) || (size <= (ulong)(long)iVar1)) {
    buf_local._4_4_ = -0x2980;
  }
  else {
    uVar2 = size - (long)iVar1;
    key_size_str._6_8_ = (long)iVar1 + key_size_str._6_8_;
    iVar1 = snprintf((char *)key_size_str._6_8_,uVar2,"\n%ssubject name  : ",prefix);
    if ((iVar1 < 0) || (uVar2 <= (ulong)(long)iVar1)) {
      buf_local._4_4_ = -0x2980;
    }
    else {
      uVar2 = uVar2 - (long)iVar1;
      key_size_str._6_8_ = (long)iVar1 + key_size_str._6_8_;
      iVar1 = mbedtls_x509_dn_gets((char *)key_size_str._6_8_,uVar2,&csr->subject);
      if ((iVar1 < 0) || (uVar2 <= (ulong)(long)iVar1)) {
        buf_local._4_4_ = -0x2980;
      }
      else {
        uVar2 = uVar2 - (long)iVar1;
        key_size_str._6_8_ = (long)iVar1 + key_size_str._6_8_;
        iVar1 = snprintf((char *)key_size_str._6_8_,uVar2,"\n%ssigned using  : ",prefix);
        if ((iVar1 < 0) || (uVar2 <= (ulong)(long)iVar1)) {
          buf_local._4_4_ = -0x2980;
        }
        else {
          uVar2 = uVar2 - (long)iVar1;
          key_size_str._6_8_ = (long)iVar1 + key_size_str._6_8_;
          iVar1 = mbedtls_x509_sig_alg_gets
                            ((char *)key_size_str._6_8_,uVar2,&csr->sig_oid,csr->sig_pk,csr->sig_md,
                             csr->sig_opts);
          if ((iVar1 < 0) || (uVar2 <= (ulong)(long)iVar1)) {
            buf_local._4_4_ = -0x2980;
          }
          else {
            uVar2 = uVar2 - (long)iVar1;
            key_size_str._6_8_ = (long)iVar1 + key_size_str._6_8_;
            name = mbedtls_pk_get_name(&csr->pk);
            buf_local._4_4_ = mbedtls_x509_key_size_helper(local_56,0xe,name);
            __s = key_size_str._6_8_;
            if (buf_local._4_4_ == 0) {
              sVar3 = mbedtls_pk_get_bitlen(&csr->pk);
              iVar1 = snprintf((char *)__s,uVar2,"\n%s%-14s: %d bits\n",prefix,local_56,
                               sVar3 & 0xffffffff);
              if ((iVar1 < 0) || (uVar2 <= (ulong)(long)iVar1)) {
                buf_local._4_4_ = -0x2980;
              }
              else {
                buf_local._4_4_ = (int)size - ((int)uVar2 - iVar1);
              }
            }
          }
        }
      }
    }
  }
  return buf_local._4_4_;
}

Assistant:

int mbedtls_x509_csr_info( char *buf, size_t size, const char *prefix,
                   const mbedtls_x509_csr *csr )
{
    int ret;
    size_t n;
    char *p;
    char key_size_str[BEFORE_COLON];

    p = buf;
    n = size;

    ret = mbedtls_snprintf( p, n, "%sCSR version   : %d",
                               prefix, csr->version );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%ssubject name  : ", prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_x509_dn_gets( p, n, &csr->subject );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%ssigned using  : ", prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_x509_sig_alg_gets( p, n, &csr->sig_oid, csr->sig_pk, csr->sig_md,
                             csr->sig_opts );
    MBEDTLS_X509_SAFE_SNPRINTF;

    if( ( ret = mbedtls_x509_key_size_helper( key_size_str, BEFORE_COLON,
                                      mbedtls_pk_get_name( &csr->pk ) ) ) != 0 )
    {
        return( ret );
    }

    ret = mbedtls_snprintf( p, n, "\n%s%-" BC "s: %d bits\n", prefix, key_size_str,
                          (int) mbedtls_pk_get_bitlen( &csr->pk ) );
    MBEDTLS_X509_SAFE_SNPRINTF;

    return( (int) ( size - n ) );
}